

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O3

void Aig_ManFlipFirstPo(Aig_Man_t *p)

{
  byte *pbVar1;
  void *pvVar2;
  
  if (p->vCos->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar2 = *p->vCos->pArray;
  if (((ulong)pvVar2 & 1) == 0) {
    pbVar1 = (byte *)((long)pvVar2 + 8);
    *pbVar1 = *pbVar1 ^ 1;
    return;
  }
  __assert_fail("!Aig_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                ,0x13c,"void Aig_ObjChild0Flip(Aig_Obj_t *)");
}

Assistant:

void Aig_ManFlipFirstPo( Aig_Man_t * p )
{
    Aig_ObjChild0Flip( Aig_ManCo(p, 0) ); 
}